

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,char (*arg) [13],unsigned_long *arg_1)

{
  Arg *in_R9;
  string_view data;
  string_view format_00;
  string local_b0;
  Arg local_90;
  string_view local_60 [3];
  
  format_00._M_len = format._M_str;
  local_60[0] = absl::lts_20240722::NullSafeStringView(*arg);
  absl::lts_20240722::substitute_internal::Arg::Arg(&local_90,*arg_1);
  format_00._M_str = (char *)local_60;
  absl::lts_20240722::Substitute_abi_cxx11_
            (&local_b0,(lts_20240722 *)format._M_len,format_00,&local_90,in_R9);
  data._M_str = local_b0._M_dataplus._M_p;
  data._M_len = local_b0._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }